

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_file_types.cpp
# Opt level: O0

char * crnlib::get_texture_type_desc(texture_type t)

{
  texture_type t_local;
  char *local_8;
  
  switch(t) {
  case cTextureTypeUnknown:
    local_8 = "Unknown";
    break;
  case cTextureTypeRegularMap:
    local_8 = "2D map";
    break;
  case cTextureTypeNormalMap:
    local_8 = "Normal map";
    break;
  case cTextureTypeVerticalCrossCubemap:
    local_8 = "Vertical Cross Cubemap";
    break;
  case cTextureTypeCubemap:
    local_8 = "Cubemap";
    break;
  default:
    local_8 = "?";
  }
  return local_8;
}

Assistant:

const char* get_texture_type_desc(texture_type t) {
  switch (t) {
    case cTextureTypeUnknown:
      return "Unknown";
    case cTextureTypeRegularMap:
      return "2D map";
    case cTextureTypeNormalMap:
      return "Normal map";
    case cTextureTypeVerticalCrossCubemap:
      return "Vertical Cross Cubemap";
    case cTextureTypeCubemap:
      return "Cubemap";
    default:
      break;
  }

  CRNLIB_ASSERT(false);

  return "?";
}